

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.h
# Opt level: O0

void __thiscall
capnp::_::TestCapDestructor::TestCapDestructor
          (TestCapDestructor *this,Own<kj::PromiseFulfiller<void>_> *fulfiller)

{
  Own<kj::PromiseFulfiller<void>_> *other;
  Own<kj::PromiseFulfiller<void>_> *fulfiller_local;
  TestCapDestructor *this_local;
  
  Capability::Server::Server((Server *)&this->field_0x40);
  capnproto_test::capnp::test::TestInterface::Server::Server
            (&this->super_Server,&PTR_construction_vtable_24__00cbcda8);
  (this->super_Server)._vptr_Server = (_func_int **)0xcbcd60;
  *(undefined8 *)&this->field_0x40 = 0xcbcd98;
  other = kj::mv<kj::Own<kj::PromiseFulfiller<void>>>(fulfiller);
  kj::Own<kj::PromiseFulfiller<void>_>::Own
            ((Own<kj::PromiseFulfiller<void>_> *)&(this->super_Server).field_0x8,other);
  this->dummy = 0;
  TestInterfaceImpl::TestInterfaceImpl(&this->impl,&this->dummy);
  return;
}

Assistant:

TestCapDestructor(kj::Own<kj::PromiseFulfiller<void>>&& fulfiller)
      : fulfiller(kj::mv(fulfiller)), impl(dummy) {}